

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O3

void __thiscall xercesc_4_0::WFElemStack::addPrefix(WFElemStack *this,XMLCh *prefixToAdd,uint uriId)

{
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar1;
  StackElem *pSVar2;
  PrefMapElem *pPVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  EmptyStackException *this_00;
  XMLCh *pXVar8;
  XMLCh XVar9;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar10;
  
  if (this->fStackTop == 0) {
    this_00 = (EmptyStackException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,0x2d0,ElemStack_EmptyStack,this->fMemoryManager);
    __cxa_throw(this_00,&EmptyStackException::typeinfo,XMLException::~XMLException);
  }
  pRVar1 = (this->fPrefixPool).fHashTable;
  pSVar2 = this->fStack[this->fStackTop - 1];
  if ((prefixToAdd == (XMLCh *)0x0) || (uVar7 = (ulong)(ushort)*prefixToAdd, uVar7 == 0)) {
    uVar7 = 0;
  }
  else {
    XVar9 = prefixToAdd[1];
    if (XVar9 != L'\0') {
      pXVar8 = prefixToAdd + 2;
      do {
        uVar7 = (ulong)(ushort)XVar9 + (uVar7 >> 0x18) + uVar7 * 0x26;
        XVar9 = *pXVar8;
        pXVar8 = pXVar8 + 1;
      } while (XVar9 != L'\0');
    }
    uVar7 = uVar7 % pRVar1->fHashModulus;
  }
  pRVar10 = pRVar1->fBucketList[uVar7];
  if (pRVar10 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar4 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,prefixToAdd,pRVar10->fKey);
      if (bVar4) {
        if (pRVar10->fData != (PoolElem *)0x0) {
          uVar5 = pRVar10->fData->fId;
          goto LAB_0029ca43;
        }
        break;
      }
      pRVar10 = pRVar10->fNext;
    } while (pRVar10 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  uVar5 = XMLStringPool::addNewEntry(&this->fPrefixPool,prefixToAdd);
LAB_0029ca43:
  iVar6 = pSVar2->fTopPrefix;
  if (this->fMapCapacity == (ulong)(iVar6 + 1)) {
    expandMap(this);
    iVar6 = pSVar2->fTopPrefix;
  }
  pPVar3 = this->fMap;
  pPVar3[(long)iVar6 + 1].fPrefId = uVar5;
  pPVar3[(long)iVar6 + 1].fURIId = uriId;
  pSVar2->fTopPrefix = iVar6 + 1;
  return;
}

Assistant:

void WFElemStack::addPrefix(  const   XMLCh* const    prefixToAdd
                              , const unsigned int    uriId)
{
    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if ((unsigned int)curRow->fTopPrefix + 1 == fMapCapacity)
        expandMap();

    //
    //  And now add a new element for this prefix. Watch for the special case
    //  of xmlns=="", and force it to ""=[globalid]
    //
    fMap[curRow->fTopPrefix + 1].fPrefId = prefId;
    if ((prefId == fGlobalPoolId) && (uriId == fEmptyNamespaceId))
        fMap[curRow->fTopPrefix + 1].fURIId = fEmptyNamespaceId;
    else
        fMap[curRow->fTopPrefix + 1].fURIId = uriId;

    // Bump the map count now
    curRow->fTopPrefix++;
}